

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

void * Curl_ssl_get_internals(Curl_easy *data,int sockindex,CURLINFO info,int n)

{
  long *plVar1;
  undefined8 uVar2;
  Curl_cfilter *pCVar3;
  cf_call_data save;
  ssl_connect_data *connssl;
  Curl_cfilter *cf;
  void *result;
  int n_local;
  CURLINFO info_local;
  int sockindex_local;
  Curl_easy *data_local;
  
  cf = (Curl_cfilter *)0x0;
  if ((data->conn != (connectdata *)0x0) &&
     (pCVar3 = get_ssl_filter(data->conn->cfilter[sockindex]), pCVar3 != (Curl_cfilter *)0x0)) {
    plVar1 = (long *)pCVar3->ctx;
    uVar2 = *(undefined8 *)((long)pCVar3->ctx + 0x48);
    *(Curl_easy **)((long)pCVar3->ctx + 0x48) = data;
    cf = (Curl_cfilter *)(**(code **)(*plVar1 + 0x68))(pCVar3->ctx,info);
    *(undefined8 *)((long)pCVar3->ctx + 0x48) = uVar2;
  }
  return cf;
}

Assistant:

void *Curl_ssl_get_internals(struct Curl_easy *data, int sockindex,
                             CURLINFO info, int n)
{
  void *result = NULL;
  (void)n;
  if(data->conn) {
    struct Curl_cfilter *cf;
    /* get first SSL filter in chain, if any is present */
    cf = get_ssl_filter(data->conn->cfilter[sockindex]);
    if(cf) {
      struct ssl_connect_data *connssl = cf->ctx;
      struct cf_call_data save;
      CF_DATA_SAVE(save, cf, data);
      result = connssl->ssl_impl->get_internals(cf->ctx, info);
      CF_DATA_RESTORE(cf, save);
    }
  }
  return result;
}